

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  (this->Buf).Size = 0;
  (this->Buf).Capacity = 0;
  (this->Buf).Data = (char *)0x0;
  uStack_18 = in_RAX & 0xffffffffffffff;
  ImVector<char>::push_back(&this->Buf,(value_type_conflict1 *)((long)&uStack_18 + 7));
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }